

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall QWidgetTextControlPrivate::updateCurrentCharFormat(QWidgetTextControlPrivate *this)

{
  ulong uVar1;
  QWidgetTextControlPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidgetTextControl *q;
  QTextCharFormat fmt;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::charFormat();
  uVar1 = QTextFormat::operator==
                    ((QTextFormat *)&local_18,&(in_RDI->lastCharFormat).super_QTextFormat);
  if ((uVar1 & 1) == 0) {
    QTextCharFormat::operator=
              ((QTextCharFormat *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (QTextCharFormat *)in_RDI);
    QWidgetTextControl::currentCharFormatChanged
              ((QWidgetTextControl *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (QTextCharFormat *)in_RDI);
    QWidgetTextControl::microFocusChanged((QWidgetTextControl *)0x70fe3e);
  }
  QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x70fe50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::updateCurrentCharFormat()
{
    Q_Q(QWidgetTextControl);

    QTextCharFormat fmt = cursor.charFormat();
    if (fmt == lastCharFormat)
        return;
    lastCharFormat = fmt;

    emit q->currentCharFormatChanged(fmt);
    emit q->microFocusChanged();
}